

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

bool __thiscall cmCTestGIT::UpdateByFetchAndReset(cmCTestGIT *this)

{
  undefined **ppuVar1;
  cmCTest *pcVar2;
  bool bVar3;
  long *plVar4;
  ostream *poVar5;
  long lVar6;
  long *plVar7;
  string *arg;
  pointer pbVar8;
  char *git_reset [5];
  string sha1;
  vector<const_char_*,_std::allocator<const_char_*>_> git_fetch;
  OutputLogger reset_err;
  string opts;
  char *git;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  OutputLogger fetch_out;
  OutputLogger fetch_err;
  OutputLogger reset_out;
  undefined1 local_3a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  undefined8 local_388;
  undefined1 *local_378;
  long local_370;
  undefined1 local_368;
  undefined7 uStack_367;
  char **local_358;
  undefined8 uStack_350;
  long local_348;
  OutputLogger local_340;
  cmCTestGIT *local_300;
  string local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  undefined1 local_2b8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  OutputLogger local_278;
  undefined1 local_238 [32];
  byte abStack_218 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [30];
  
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_358 = (char **)0x0;
  uStack_350 = 0;
  local_348 = 0;
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_358,(iterator)0x0,
             (char **)&local_2d8);
  local_238._0_8_ = "fetch";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_358,(char **)local_238);
  pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  ppuVar1 = (undefined **)(local_238 + 0x10);
  local_238._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"UpdateOptions","");
  cmCTest::GetCTestConfiguration(&local_2f8,pcVar2,(string *)local_238);
  if ((undefined **)local_238._0_8_ != ppuVar1) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  if (local_2f8._M_string_length == 0) {
    pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    local_2b8._0_8_ = local_2b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"GITUpdateOptions","");
    cmCTest::GetCTestConfiguration((string *)local_238,pcVar2,(string *)local_2b8);
    std::__cxx11::string::operator=((string *)&local_2f8,(string *)local_238);
    if ((undefined **)local_238._0_8_ != ppuVar1) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
    }
  }
  cmSystemTools::ParseArguments(&local_2d0,&local_2f8);
  if (local_2d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar8 = local_2d0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_238._0_8_ = (pbVar8->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_358,(char **)local_238);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != local_2d0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_238._0_8_ = (undefined **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_358,(char **)local_238);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_2b8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "fetch-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_278,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"fetch-err> ");
  bVar3 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,local_358,(OutputParser *)local_2b8,
                     (OutputParser *)&local_278,Auto);
  if (!bVar3) {
    bVar3 = false;
    goto LAB_00208c9e;
  }
  local_378 = &local_368;
  local_370 = 0;
  local_368 = 0;
  FindGitDir_abi_cxx11_((string *)local_238,this);
  plVar4 = (long *)std::__cxx11::string::append(local_238);
  local_340.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&local_340.super_LineParser.Prefix;
  plVar7 = plVar4 + 2;
  if ((char **)*plVar4 == (char **)plVar7) {
    local_340.super_LineParser.Prefix = (char *)*plVar7;
    local_340.super_LineParser.Line._M_dataplus._M_p = (pointer)plVar4[3];
  }
  else {
    local_340.super_LineParser.Prefix = (char *)*plVar7;
    local_340.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)*plVar4;
  }
  local_340.super_LineParser.Log = (ostream *)plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((undefined **)local_238._0_8_ != ppuVar1) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  std::ifstream::ifstream
            (local_238,(char *)local_340.super_LineParser.super_OutputParser._vptr_OutputParser,
             _S_in|_S_bin);
  if ((abStack_218[(long)*(undefined **)(local_238._0_8_ + -0x18)] & 5) == 0) {
    local_3a8._0_8_ = &local_398;
    local_3a8._8_8_ = (char *)0x0;
    local_398._M_allocated_capacity = local_398._M_allocated_capacity & 0xffffffffffffff00;
    bVar3 = true;
    if (local_370 == 0) {
      local_300 = this;
      do {
        bVar3 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)local_238,(string *)local_3a8,(bool *)0x0,0xffffffffffffffff);
        if (!bVar3) {
          bVar3 = true;
          if (local_370 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                       "FETCH_HEAD has no upstream branch candidate!\n",0x2d);
            bVar3 = false;
          }
          goto LAB_00208b5f;
        }
        poVar5 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"FETCH_HEAD> ",0xc);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_3a8._0_8_,local_3a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        lVar6 = std::__cxx11::string::find(local_3a8,0x747224,0);
        if (lVar6 == -1) {
          lVar6 = std::__cxx11::string::find((char)local_3a8,9);
          if (lVar6 != -1) {
            std::__cxx11::string::operator=((string *)&local_378,(string *)local_3a8);
            this = local_300;
            std::__cxx11::string::resize((ulong)&local_378,(char)lVar6);
          }
        }
      } while (local_370 == 0);
      bVar3 = true;
    }
LAB_00208b5f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._0_8_ != &local_398) {
      operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._M_allocated_capacity + 1));
    }
    std::ifstream::~ifstream(local_238);
    if (local_340.super_LineParser.super_OutputParser._vptr_OutputParser !=
        (_func_int **)&local_340.super_LineParser.Prefix) {
      operator_delete(local_340.super_LineParser.super_OutputParser._vptr_OutputParser,
                      (ulong)(local_340.super_LineParser.Prefix + 1));
    }
    if (!bVar3) goto LAB_00208c85;
    local_3a8._0_8_ = local_2d8;
    local_3a8._8_8_ = "reset";
    local_398._M_allocated_capacity = 0x747262;
    local_398._8_8_ = local_378;
    local_388 = 0;
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)local_238,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "reset-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              (&local_340,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"reset-err> ");
    bVar3 = cmCTestVC::RunChild((cmCTestVC *)this,(char **)local_3a8,(OutputParser *)local_238,
                                (OutputParser *)&local_340,(char *)0x0,Auto);
    local_340.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_0094d8f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340.super_LineParser.Line._M_dataplus._M_p !=
        &local_340.super_LineParser.Line.field_2) {
      operator_delete(local_340.super_LineParser.Line._M_dataplus._M_p,
                      local_340.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    local_238._0_8_ = &PTR__LineParser_0094d8f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._24_8_ != local_210) {
      operator_delete((void *)local_238._24_8_,local_210[0]._M_allocated_capacity + 1);
    }
  }
  else {
    poVar5 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Unable to open ",0xf);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_340.super_LineParser.super_OutputParser.
                                       _vptr_OutputParser,(long)local_340.super_LineParser.Log);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::ifstream::~ifstream(local_238);
    if (local_340.super_LineParser.super_OutputParser._vptr_OutputParser !=
        (_func_int **)&local_340.super_LineParser.Prefix) {
      operator_delete(local_340.super_LineParser.super_OutputParser._vptr_OutputParser,
                      (ulong)(local_340.super_LineParser.Prefix + 1));
    }
LAB_00208c85:
    bVar3 = false;
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,CONCAT71(uStack_367,local_368) + 1);
  }
LAB_00208c9e:
  local_278.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_0094d8f8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.super_LineParser.Line._M_dataplus._M_p !=
      &local_278.super_LineParser.Line.field_2) {
    operator_delete(local_278.super_LineParser.Line._M_dataplus._M_p,
                    local_278.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_2b8._0_8_ = &PTR__LineParser_0094d8f8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._24_8_ != &local_290) {
    operator_delete((void *)local_2b8._24_8_,local_290._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_358 != (char **)0x0) {
    operator_delete(local_358,local_348 - (long)local_358);
  }
  return bVar3;
}

Assistant:

bool cmCTestGIT::UpdateByFetchAndReset()
{
  const char* git = this->CommandLineTool.c_str();

  // Use "git fetch" to get remote commits.
  std::vector<char const*> git_fetch;
  git_fetch.push_back(git);
  git_fetch.push_back("fetch");

  // Add user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("GITUpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);
  for (std::string const& arg : args) {
    git_fetch.push_back(arg.c_str());
  }

  // Sentinel argument.
  git_fetch.push_back(nullptr);

  // Fetch upstream refs.
  OutputLogger fetch_out(this->Log, "fetch-out> ");
  OutputLogger fetch_err(this->Log, "fetch-err> ");
  if (!this->RunUpdateCommand(git_fetch.data(), &fetch_out, &fetch_err)) {
    return false;
  }

  // Identify the merge head that would be used by "git pull".
  std::string sha1;
  {
    std::string fetch_head = this->FindGitDir() + "/FETCH_HEAD";
    cmsys::ifstream fin(fetch_head.c_str(), std::ios::in | std::ios::binary);
    if (!fin) {
      this->Log << "Unable to open " << fetch_head << "\n";
      return false;
    }
    std::string line;
    while (sha1.empty() && cmSystemTools::GetLineFromStream(fin, line)) {
      this->Log << "FETCH_HEAD> " << line << "\n";
      if (line.find("\tnot-for-merge\t") == std::string::npos) {
        std::string::size_type pos = line.find('\t');
        if (pos != std::string::npos) {
          sha1 = std::move(line);
          sha1.resize(pos);
        }
      }
    }
    if (sha1.empty()) {
      this->Log << "FETCH_HEAD has no upstream branch candidate!\n";
      return false;
    }
  }

  // Reset the local branch to point at that tracked from upstream.
  char const* git_reset[] = { git, "reset", "--hard", sha1.c_str(), nullptr };
  OutputLogger reset_out(this->Log, "reset-out> ");
  OutputLogger reset_err(this->Log, "reset-err> ");
  return this->RunChild(&git_reset[0], &reset_out, &reset_err);
}